

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::Texture2DArrayFormatCase::Texture2DArrayFormatCase
          (Texture2DArrayFormatCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,deUint32 format,deUint32 dataType,int width,int height,int numLayers)

{
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture2DArrayFormatCase_01e2d210;
  this->m_renderCtx = renderCtx;
  this->m_format = format;
  this->m_dataType = dataType;
  this->m_width = width;
  this->m_height = height;
  this->m_numLayers = numLayers;
  this->m_texture = (Texture2DArray *)0x0;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,testCtx->m_log,GLSL_VERSION_300_ES,PRECISION_HIGHP);
  this->m_curLayer = 0;
  return;
}

Assistant:

Texture2DArrayFormatCase::Texture2DArrayFormatCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, deUint32 format, deUint32 dataType, int width, int height, int numLayers)
	: TestCase		(testCtx, name, description)
	, m_renderCtx	(renderCtx)
	, m_format		(format)
	, m_dataType	(dataType)
	, m_width		(width)
	, m_height		(height)
	, m_numLayers	(numLayers)
	, m_texture		(DE_NULL)
	, m_renderer	(renderCtx, testCtx.getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
	, m_curLayer	(0)
{
}